

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O3

SStyleRunInfo * __thiscall
Am_Rich_Text_Data::Calc_SR_Dim
          (SStyleRunInfo *__return_storage_ptr__,Am_Rich_Text_Data *this,Am_Drawonable *inDrawonable
          ,Am_Text_Style_Run *inStyleRun,Am_Text_Fragment *inStartFrag,Am_Text_Offset inFragRelIndex
          ,Am_Text_Index inMaxChars)

{
  Am_Text_Fragment *pAVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  Am_Font font;
  Am_Font AStack_38;
  undefined1 local_2c [4];
  
  __return_storage_ptr__->width_used = 0;
  __return_storage_ptr__->end_frag = inStartFrag;
  __return_storage_ptr__->end_frag_offset = inFragRelIndex;
  Am_Font::Am_Font(&AStack_38,&inStyleRun->mFont);
  (*inDrawonable->_vptr_Am_Drawonable[0x1b])
            (inDrawonable,&AStack_38,local_2c,local_2c,&__return_storage_ptr__->ascent,
             &__return_storage_ptr__->descent);
  uVar5 = __return_storage_ptr__->end_frag->mStrLen;
  pcVar3 = (char *)0x0;
  if ((inFragRelIndex & 0xffffffffU) < uVar5) {
    pcVar3 = __return_storage_ptr__->end_frag->mString + inFragRelIndex;
  }
  uVar5 = uVar5 - inFragRelIndex;
  while( true ) {
    iVar6 = (int)inMaxChars;
    if (iVar6 < (int)uVar5) {
      uVar5 = inMaxChars;
    }
    iVar4 = (int)uVar5;
    iVar2 = (*inDrawonable->_vptr_Am_Drawonable[0x19])
                      (inDrawonable,&AStack_38,pcVar3,uVar5 & 0xffffffff);
    __return_storage_ptr__->width_used = __return_storage_ptr__->width_used + (long)iVar2;
    __return_storage_ptr__->end_frag_offset = __return_storage_ptr__->end_frag_offset + (long)iVar4;
    inMaxChars = (Am_Text_Index)(uint)(iVar6 - iVar4);
    if (iVar6 - iVar4 == 0 || iVar6 < iVar4) break;
    pAVar1 = __return_storage_ptr__->end_frag->mNext;
    __return_storage_ptr__->end_frag = pAVar1;
    __return_storage_ptr__->end_frag_offset = 0;
    if (pAVar1 == (Am_Text_Fragment *)0x0) {
      Am_Error("Rich Text Engine: Unexpected null fragment in Calc_SR_Dim");
    }
    uVar5 = pAVar1->mStrLen;
    pcVar3 = pAVar1->mString;
    if (uVar5 == 0) {
      pcVar3 = (char *)0x0;
    }
  }
  Am_Font::~Am_Font(&AStack_38);
  return __return_storage_ptr__;
}

Assistant:

SStyleRunInfo
Am_Rich_Text_Data::Calc_SR_Dim(Am_Drawonable *inDrawonable,
                               Am_Text_Style_Run *inStyleRun,
                               Am_Text_Fragment *inStartFrag,
                               Am_Text_Offset inFragRelIndex,
                               Am_Text_Index inMaxChars)
{
  SStyleRunInfo ret;
  ret.width_used = 0;
  ret.end_frag = inStartFrag;
  ret.end_frag_offset = inFragRelIndex;

  Am_Font font = inStyleRun->Get_Font();

  int ign;
  inDrawonable->Get_Font_Properties(font, ign, ign, ret.ascent, ret.descent);

  char *string = ret.end_frag->String(inFragRelIndex);

  int charsRem = (int)inMaxChars,
      charsRemInFrag = (int)(ret.end_frag->Length() - inFragRelIndex);

  //
  while (true) {
    int charsToMeasure = min(charsRem, charsRemInFrag);

    ret.width_used +=
        inDrawonable->Get_String_Width(font, string, charsToMeasure);

    charsRem -= charsToMeasure;
    ret.end_frag_offset += charsToMeasure;

    if (charsRem > 0) {
      ret.end_frag = ret.end_frag->Next();
      ret.end_frag_offset = 0;

      if (ret.end_frag == nullptr)
        Am_Error("Rich Text Engine: Unexpected null fragment in Calc_SR_Dim");

      string = ret.end_frag->String(0);
      charsRemInFrag = (int)ret.end_frag->Length();
    } else
      break;
  }

  return ret;

  /*
  // Searches for the fragment which contains the end of the style run (1)
  //  or whose width would be longer than the wanted width (2)
  // Assumes that string and strLen are correct at top of loop
  while( ret.end_frag != (0L) )
  {
    // See if the style run extends past the ret.end_fragment
    if( (ret.chars_used + charsRemInFrag) > charsRem ) // (1)
      break;
    // Only continues if the style run goes into the next fragment.
    // Therefore ret.end_frag->Next() can not equal (0L). If it did the style
    // run would have been too long resulting in an error (3)

    strWidth = inDrawonable->Get_String_Width( inStyleRun->Get_Font(),
                                               string, charsRem );
    // see if the frags width in pixels is longer that the desired width
//    if( strWidth >= widthRemaining ) // (2)
//      break;

    // skip to next fragment
    ret.width_used += strWidth;
    ret.chars_used += charsRemInFrag;
//    widthRemaining -= strWidth;
    charsRem       -= charsRemInFrag;

    ret.end_frag = ret.end_frag->Next();
//    ret.end_frag_rel_index = 0;
    if( ret.end_frag != (0L) )
    {
      charsRemInFrag = ret.end_frag->Length();
      string = ret.end_frag->String( 0 );
    }
    else
    {
      // This should never happen.
    }
  }

  // outCharsUsed and widthRemaining only go up to the previous fragment
  // At this point frag != (0L). It is an error for this to happen.
  if( ret.end_frag == (0L) ) // (3)
    Am_Error("** In Am_Rich_Text_Data::Calc_Style_Run_Dim: frag == (0L).");

  // At this point we know that we will either
  //   * run out of pixels (width filled)
  //       or
  //   * run out of chars in this style run (end of style)

  Am_Text_Length charCount = 0;
  unsigned long tmpWidth = 0;
  strWidth = 0;
  while( true )
  {
    if( charCount >= charsRem )
    {
      ret.chars_used += charCount; // should be (+= charCount-1)
      ret.width_used += strWidth;
      return ret;
    }

    // we have at least one more char left
    tmpWidth = inDrawonable->Get_String_Width( inStyleRun->Get_Font(),
                                               string, charCount + 1 );
//    if( tmpWidth < widthRemaining )
//    {
      charCount++;
      strWidth = tmpWidth;
//    }
//    else
//    {
//      ret.end_frag_rel_index = charCount;
//      break;
//    }
  }
//  widthRemaining -= strWidth;

  ret.chars_used += charCount;
  ret.width_used = inMaxWidth - widthRemaining;

  return ret;
*/
}